

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdiriterator.cpp
# Opt level: O1

void __thiscall QDirIterator::QDirIterator(QDirIterator *this,QString *path,IteratorFlags flags)

{
  _Head_base<0UL,_QDirIteratorPrivate_*,_false> this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl = (QDirIteratorPrivate *)operator_new(0x20);
  local_48.d = (Data *)0x0;
  local_48.ptr = (QString *)0x0;
  local_48.size = 0;
  QDirIteratorPrivate::QDirIteratorPrivate
            (this_00._M_head_impl,path,(QStringList *)&local_48,(Filters)0xffffffff,flags);
  (this->d)._M_t.
  super___uniq_ptr_impl<QDirIteratorPrivate,_std::default_delete<QDirIteratorPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QDirIteratorPrivate_*,_std::default_delete<QDirIteratorPrivate>_>.
  super__Head_base<0UL,_QDirIteratorPrivate_*,_false>._M_head_impl = this_00._M_head_impl;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirIterator::QDirIterator(const QString &path, IteratorFlags flags)
    : d(new QDirIteratorPrivate(path, {}, QDir::NoFilter, flags))
{
}